

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

int mbedtls_des_self_test(int verbose)

{
  undefined8 uVar1;
  char *pcVar2;
  uchar (*pauVar3) [8];
  uint uVar4;
  int iVar5;
  bool bVar6;
  uchar buf [8];
  int local_24c;
  uchar iv [8];
  mbedtls_des_context ctx;
  mbedtls_des3_context ctx3;
  
  ctx.sk[0] = 0;
  ctx.sk[1] = 0;
  ctx.sk[2] = 0;
  ctx.sk[3] = 0;
  ctx.sk[4] = 0;
  ctx.sk[5] = 0;
  ctx.sk[6] = 0;
  ctx.sk[7] = 0;
  ctx.sk[8] = 0;
  ctx.sk[9] = 0;
  ctx.sk[10] = 0;
  ctx.sk[0xb] = 0;
  ctx.sk[0xc] = 0;
  ctx.sk[0xd] = 0;
  ctx.sk[0xe] = 0;
  ctx.sk[0xf] = 0;
  ctx.sk[0x10] = 0;
  ctx.sk[0x11] = 0;
  ctx.sk[0x12] = 0;
  ctx.sk[0x13] = 0;
  ctx.sk[0x14] = 0;
  ctx.sk[0x15] = 0;
  ctx.sk[0x16] = 0;
  ctx.sk[0x17] = 0;
  ctx.sk[0x18] = 0;
  ctx.sk[0x19] = 0;
  ctx.sk[0x1a] = 0;
  ctx.sk[0x1b] = 0;
  ctx.sk[0x1c] = 0;
  ctx.sk[0x1d] = 0;
  ctx.sk[0x1e] = 0;
  ctx.sk[0x1f] = 0;
  memset(&ctx3,0,0x180);
  for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
    if (verbose != 0) {
      uVar1 = 0x33;
      if (uVar4 < 2) {
        uVar1 = 0x20;
      }
      pcVar2 = "enc";
      if ((uVar4 & 1) == 0) {
        pcVar2 = "dec";
      }
      printf("  DES%c-ECB-%3d (%s): ",uVar1,(ulong)((uVar4 >> 1) * 0x38 + 0x38),pcVar2);
    }
    builtin_memcpy(buf,"Now is t",8);
    mbedtls_des_setkey_dec(&ctx,des3_test_keys);
    iVar5 = 10000;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      if (uVar4 < 2) {
        mbedtls_des_crypt_ecb(&ctx,buf,buf);
      }
      else {
        mbedtls_des3_crypt_ecb(&ctx3,buf,buf);
      }
    }
    if ((uVar4 & 1) == 0) {
      pauVar3 = des3_test_ecb_dec;
    }
    else {
      pauVar3 = des3_test_ecb_enc;
    }
    if (buf != pauVar3[uVar4 >> 1]) goto LAB_0016afd4;
    if (verbose != 0) {
      puts("passed");
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
    if (verbose != 0) {
      uVar1 = 0x33;
      if (uVar4 < 2) {
        uVar1 = 0x20;
      }
      pcVar2 = "enc";
      if ((uVar4 & 1) == 0) {
        pcVar2 = "dec";
      }
      printf("  DES%c-CBC-%3d (%s): ",uVar1,(ulong)((uVar4 >> 1) * 0x38 + 0x38),pcVar2);
    }
    iv[0] = '\x12';
    iv[1] = '4';
    iv[2] = 'V';
    iv[3] = 'x';
    iv[4] = 0x90;
    iv[5] = 0xab;
    iv[6] = 0xcd;
    iv[7] = 0xef;
    builtin_memcpy(buf,"Now is t",8);
    mbedtls_des_setkey_dec(&ctx,des3_test_keys);
    iVar5 = 10000;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      if (uVar4 < 2) {
        mbedtls_des_crypt_cbc(&ctx,0,8,iv,buf,buf);
      }
      else {
        mbedtls_des3_crypt_cbc(&ctx3,0,8,iv,buf,buf);
      }
    }
    if (buf != des3_test_cbc_dec[uVar4 >> 1]) goto LAB_0016afd4;
    if (verbose != 0) {
      puts("passed");
    }
  }
  local_24c = 0;
  if (verbose != 0) {
    putchar(10);
  }
LAB_0016b000:
  mbedtls_des_free(&ctx);
  mbedtls_des3_free(&ctx3);
  return local_24c;
LAB_0016afd4:
  local_24c = 1;
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_0016b000;
}

Assistant:

int mbedtls_des_self_test( int verbose )
{
    int i, j, u, v, ret = 0;
    mbedtls_des_context ctx;
    mbedtls_des3_context ctx3;
    unsigned char buf[8];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[8];
    unsigned char iv[8];
#endif

    mbedtls_des_init( &ctx );
    mbedtls_des3_init( &ctx3 );
    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-ECB-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        for( j = 0; j < 10000; j++ )
        {
            if( u == 0 )
                mbedtls_des_crypt_ecb( &ctx, buf, buf );
            else
                mbedtls_des3_crypt_ecb( &ctx3, buf, buf );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-CBC-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  des3_test_iv,  8 );
        memcpy( prv, des3_test_iv,  8 );
        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        if( v == MBEDTLS_DES_DECRYPT )
        {
            for( j = 0; j < 10000; j++ )
            {
                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );
            }
        }
        else
        {
            for( j = 0; j < 10000; j++ )
            {
                unsigned char tmp[8];

                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );

                memcpy( tmp, prv, 8 );
                memcpy( prv, buf, 8 );
                memcpy( buf, tmp, 8 );
            }

            memcpy( buf, prv, 8 );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_des_free( &ctx );
    mbedtls_des3_free( &ctx3 );

    return( ret );
}